

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O2

int __thiscall
jrtplib::
RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
::DeleteElement(RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
                *this,RTPIPv6Destination *elem)

{
  int iVar1;
  
  iVar1 = GotoElement(this,elem);
  if (-1 < iVar1) {
    iVar1 = DeleteCurrentElement(this);
    return iVar1;
  }
  return iVar1;
}

Assistant:

inline int RTPHashTable<Element,GetIndex,hashsize>::DeleteElement(const Element &elem)
{
	int status;

	status = GotoElement(elem);
	if (status < 0)
		return status;
	return DeleteCurrentElement();
}